

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
::erase_meta_only(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                  *this,const_iterator it)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_t *psVar4;
  ctrl_t *in_RSI;
  long *in_RDI;
  bool was_never_full;
  BitMask<unsigned_int,_16,_0> empty_before;
  BitMask<unsigned_int,_16,_0> empty_after;
  size_t index_before;
  size_t index;
  GroupSse2Impl *in_stack_ffffffffffffff68;
  BitMask<unsigned_int,_16,_0> *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 uVar5;
  uint32_t in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  byte bVar6;
  GroupSse2Impl local_68;
  uint local_4c;
  GroupSse2Impl local_48;
  uint local_2c;
  ulong local_28;
  long local_20;
  ctrl_t *local_10;
  
  local_10 = in_RSI;
  bVar1 = IsFull(*in_RSI);
  if (bVar1) {
    in_RDI[2] = in_RDI[2] + -1;
    local_20 = (long)local_10 - *in_RDI;
    local_28 = local_20 - 0x10U & in_RDI[3];
    GroupSse2Impl::GroupSse2Impl(&local_48,local_10);
    local_2c = (uint)GroupSse2Impl::MatchEmpty(in_stack_ffffffffffffff68);
    GroupSse2Impl::GroupSse2Impl(&local_68,(ctrl_t *)(*in_RDI + local_28));
    local_4c = (uint)GroupSse2Impl::MatchEmpty(in_stack_ffffffffffffff68);
    bVar1 = BitMask::operator_cast_to_bool((BitMask *)&local_4c);
    in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
    if (bVar1) {
      bVar1 = BitMask::operator_cast_to_bool((BitMask *)&local_2c);
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
      if (bVar1) {
        in_stack_ffffffffffffff80 =
             BitMask<unsigned_int,_16,_0>::TrailingZeros((BitMask<unsigned_int,_16,_0> *)0x5413e7);
        uVar2 = BitMask<unsigned_int,_16,_0>::LeadingZeros(in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff84 =
             CONCAT13(in_stack_ffffffffffffff80 + uVar2 < 0x10,(int3)in_stack_ffffffffffffff84);
      }
    }
    bVar6 = (byte)(in_stack_ffffffffffffff84 >> 0x18);
    uVar5 = 0x80;
    if (bVar6 == 0) {
      uVar5 = 0xfe;
    }
    set_ctrl((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
              *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             CONCAT17(uVar5,CONCAT16(0xfe,in_stack_ffffffffffffff78)),
             (ctrl_t)((ulong)local_20 >> 0x38));
    uVar3 = (ulong)bVar6;
    psVar4 = growth_left((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
                          *)0x541468);
    *psVar4 = uVar3 + *psVar4;
    HashtablezInfoHandle::RecordErase((HashtablezInfoHandle *)(in_RDI + 4));
    return;
  }
  __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8a2,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::erase_meta_only(const_iterator) [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
               );
}

Assistant:

void erase_meta_only(const_iterator it)
			{
				assert(IsFull(*it.inner_.ctrl_) && "erasing a dangling iterator");
				--size_;
				const size_t index = (size_t)(it.inner_.ctrl_ - ctrl_);
				const size_t index_before = (index - Group::kWidth) & capacity_;
				const auto empty_after = Group(it.inner_.ctrl_).MatchEmpty();
				const auto empty_before = Group(ctrl_ + index_before).MatchEmpty();

				// We count how many consecutive non empties we have to the right and to the
				// left of `it`. If the sum is >= kWidth then there is at least one probe
				// window that might have seen a full group.
				bool was_never_full =
				    empty_before && empty_after &&
				    static_cast<size_t>(empty_after.TrailingZeros() +
				                        empty_before.LeadingZeros()) < Group::kWidth;

				set_ctrl(index, was_never_full ? kEmpty : kDeleted);
				growth_left() += was_never_full;
				infoz_.RecordErase();
			}